

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tmpdir.c
# Opt level: O2

int run_test_tmpdir(void)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 uStack_420;
  size_t len;
  char tmpdir [1024];
  
  len = 0x400;
  tmpdir[0] = '\0';
  iVar1 = uv_os_tmpdir(tmpdir,&len);
  if (iVar1 == 0) {
    sVar2 = strlen(tmpdir);
    if (sVar2 == len) {
      if (sVar2 == 0) {
        pcVar3 = "len > 0";
        uStack_420 = 0x2b;
      }
      else if (tmpdir[sVar2] == '\0') {
        if ((sVar2 == 1) || (tmpdir[sVar2 - 1] != '/')) {
          len = 1;
          iVar1 = uv_os_tmpdir(tmpdir,&len);
          if (iVar1 == -0x69) {
            if (len < 2) {
              pcVar3 = "len > SMALLPATH";
              uStack_420 = 0x3b;
            }
            else {
              iVar1 = uv_os_tmpdir((char *)0x0,&len);
              if (iVar1 == -0x16) {
                iVar1 = uv_os_tmpdir(tmpdir,(size_t *)0x0);
                if (iVar1 == -0x16) {
                  len = 0;
                  iVar1 = uv_os_tmpdir(tmpdir,&len);
                  if (iVar1 == -0x16) {
                    return 0;
                  }
                  pcVar3 = "r == UV_EINVAL";
                  uStack_420 = 0x44;
                }
                else {
                  pcVar3 = "r == UV_EINVAL";
                  uStack_420 = 0x41;
                }
              }
              else {
                pcVar3 = "r == UV_EINVAL";
                uStack_420 = 0x3f;
              }
            }
          }
          else {
            pcVar3 = "r == UV_ENOBUFS";
            uStack_420 = 0x3a;
          }
        }
        else {
          pcVar3 = "last != \'/\'";
          uStack_420 = 0x33;
        }
      }
      else {
        pcVar3 = "tmpdir[len] == \'\\0\'";
        uStack_420 = 0x2c;
      }
    }
    else {
      pcVar3 = "strlen(tmpdir) == len";
      uStack_420 = 0x2a;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_420 = 0x29;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tmpdir.c"
          ,uStack_420,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tmpdir) {
  char tmpdir[PATHMAX];
  size_t len;
  char last;
  int r;

  /* Test the normal case */
  len = sizeof tmpdir;
  tmpdir[0] = '\0';

  ASSERT(strlen(tmpdir) == 0);
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT(r == 0);
  ASSERT(strlen(tmpdir) == len);
  ASSERT(len > 0);
  ASSERT(tmpdir[len] == '\0');

  if (len > 1) {
    last = tmpdir[len - 1];
#ifdef _WIN32
    ASSERT(last != '\\');
#else
    ASSERT(last != '/');
#endif
  }

  /* Test the case where the buffer is too small */
  len = SMALLPATH;
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT(r == UV_ENOBUFS);
  ASSERT(len > SMALLPATH);

  /* Test invalid inputs */
  r = uv_os_tmpdir(NULL, &len);
  ASSERT(r == UV_EINVAL);
  r = uv_os_tmpdir(tmpdir, NULL);
  ASSERT(r == UV_EINVAL);
  len = 0;
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT(r == UV_EINVAL);

#ifdef _WIN32
  const char *name = "TMP";
  char tmpdir_win[] = "C:\\xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx";
  r = uv_os_setenv(name, tmpdir_win);
  ASSERT(r == 0);
  char tmpdirx[PATHMAX];
  size_t lenx = sizeof tmpdirx;
  r = uv_os_tmpdir(tmpdirx, &lenx);
  ASSERT(r == 0);
#endif

  return 0;
}